

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metrics.cpp
# Opt level: O0

void __thiscall wasm::Metrics::printCounts(Metrics *this,string *title)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  _Setw _Var4;
  mapped_type_conflict1 *pmVar5;
  iterator iVar6;
  iterator iVar7;
  ostream *poVar8;
  reference ppcVar9;
  size_type sVar10;
  void *pvVar11;
  int after;
  int before;
  char *pcStack_c8;
  mapped_type_conflict1 value_1;
  char *key_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<const_char_*,_std::allocator<const_char_*>_> *__range2_1;
  char *local_90;
  char *local_88 [3];
  int *local_70;
  type_conflict3 *value;
  type *key;
  _Self local_58;
  iterator __end2;
  iterator __begin2;
  Counts *__range2;
  undefined1 local_38 [4];
  int total;
  vector<const_char_*,_std::allocator<const_char_*>_> keys;
  ostream *o;
  string *title_local;
  Metrics *this_local;
  
  keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&std::cout;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_38);
  __range2._4_4_ = 0;
  __end2 = std::
           map<const_char_*,_int,_std::less<const_char_*>,_std::allocator<std::pair<const_char_*const,_int>_>_>
           ::begin(&this->counts);
  local_58._M_node =
       (_Base_ptr)
       std::
       map<const_char_*,_int,_std::less<const_char_*>,_std::allocator<std::pair<const_char_*const,_int>_>_>
       ::end(&this->counts);
  while (bVar3 = std::operator!=(&__end2,&local_58), bVar3) {
    key = &std::_Rb_tree_iterator<std::pair<const_char_*const,_int>_>::operator*(&__end2)->first;
    value = (type_conflict3 *)
            std::get<0ul,char_const*const,int>((pair<const_char_*const,_int> *)key);
    local_70 = std::get<1ul,char_const*const,int>((pair<const_char_*const,_int> *)key);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_38,(value_type *)value);
    if (**(char **)value != '[') {
      __range2._4_4_ = *local_70 + __range2._4_4_;
    }
    std::_Rb_tree_iterator<std::pair<const_char_*const,_int>_>::operator++(&__end2);
  }
  local_88[0] = "[total]";
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_38,local_88);
  local_90 = "[total]";
  pmVar5 = std::
           map<const_char_*,_int,_std::less<const_char_*>,_std::allocator<std::pair<const_char_*const,_int>_>_>
           ::operator[](&this->counts,&local_90);
  *pmVar5 = __range2._4_4_;
  iVar6 = std::vector<const_char_*,_std::allocator<const_char_*>_>::begin
                    ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_38);
  iVar7 = std::vector<const_char_*,_std::allocator<const_char_*>_>::end
                    ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_38);
  std::
  sort<__gnu_cxx::__normal_iterator<char_const**,std::vector<char_const*,std::allocator<char_const*>>>,wasm::Metrics::printCounts(std::__cxx11::string)::_lambda(char_const*,char_const*)_1_>
            (iVar6._M_current,iVar7._M_current);
  poVar8 = std::operator<<((ostream *)&std::cout,(string *)title);
  std::operator<<(poVar8,"\n");
  __end2_1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::begin
                       ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_38);
  key_1 = (char *)std::vector<const_char_*,_std::allocator<const_char_*>_>::end
                            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_38);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end2_1,
                            (__normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                             *)&key_1), bVar3) {
    ppcVar9 = __gnu_cxx::
              __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
              ::operator*(&__end2_1);
    pcStack_c8 = *ppcVar9;
    pmVar5 = std::
             map<const_char_*,_int,_std::less<const_char_*>,_std::allocator<std::pair<const_char_*const,_int>_>_>
             ::operator[](&this->counts,&stack0xffffffffffffff38);
    iVar1 = *pmVar5;
    if ((iVar1 != 0) || (*pcStack_c8 == '[')) {
      poVar8 = std::operator<<((ostream *)&std::cout," ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,std::left);
      _Var4 = std::setw(0xf);
      poVar8 = std::operator<<(poVar8,_Var4);
      poVar8 = std::operator<<(poVar8,pcStack_c8);
      poVar8 = std::operator<<(poVar8,": ");
      _Var4 = std::setw(8);
      poVar8 = std::operator<<(poVar8,_Var4);
      std::ostream::operator<<(poVar8,iVar1);
      sVar10 = std::
               map<const_char_*,_int,_std::less<const_char_*>,_std::allocator<std::pair<const_char_*const,_int>_>_>
               ::count((map<const_char_*,_int,_std::less<const_char_*>,_std::allocator<std::pair<const_char_*const,_int>_>_>
                        *)lastCounts,&stack0xffffffffffffff38);
      if (sVar10 != 0) {
        pmVar5 = std::
                 map<const_char_*,_int,_std::less<const_char_*>,_std::allocator<std::pair<const_char_*const,_int>_>_>
                 ::operator[]((map<const_char_*,_int,_std::less<const_char_*>,_std::allocator<std::pair<const_char_*const,_int>_>_>
                               *)lastCounts,&stack0xffffffffffffff38);
        iVar2 = *pmVar5;
        if (iVar1 != iVar2) {
          if (iVar2 < iVar1) {
            Colors::red((ostream *)&std::cout);
          }
          else {
            Colors::green((ostream *)&std::cout);
          }
          poVar8 = (ostream *)std::ostream::operator<<(&std::cout,std::right);
          _Var4 = std::setw(8);
          std::operator<<(poVar8,_Var4);
          pvVar11 = (void *)std::ostream::operator<<(&std::cout,std::showpos);
          pvVar11 = (void *)std::ostream::operator<<(pvVar11,iVar1 - iVar2);
          std::ostream::operator<<(pvVar11,std::noshowpos);
          Colors::normal((ostream *)&std::cout);
        }
      }
      std::operator<<((ostream *)&std::cout,"\n");
    }
    __gnu_cxx::
    __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>::
    operator++(&__end2_1);
  }
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_38);
  return;
}

Assistant:

void printCounts(std::string title) {
    using std::left;
    using std::noshowpos;
    using std::right;
    using std::setw;
    using std::showpos;

    std::ostream& o = std::cout;
    std::vector<const char*> keys;
    // add total
    int total = 0;
    for (auto& [key, value] : counts) {
      keys.push_back(key);
      // total is of all the normal stuff, not the special [things]
      if (key[0] != '[') {
        total += value;
      }
    }
    keys.push_back("[total]");
    counts["[total]"] = total;
    // sort
    sort(keys.begin(), keys.end(), [](const char* a, const char* b) -> bool {
      // Sort the [..] ones first.
      if (a[0] == '[' && b[0] != '[') {
        return true;
      }
      if (a[0] != '[' && b[0] == '[') {
        return false;
      }
      return strcmp(b, a) > 0;
    });
    o << title << "\n";
    for (auto* key : keys) {
      auto value = counts[key];
      if (value == 0 && key[0] != '[') {
        continue;
      }
      o << " " << left << setw(15) << key << ": " << setw(8) << value;
      if (lastCounts.count(key)) {
        int before = lastCounts[key];
        int after = value;
        if (after - before) {
          if (after > before) {
            Colors::red(o);
          } else {
            Colors::green(o);
          }
          o << right << setw(8);
          o << showpos << after - before << noshowpos;
          Colors::normal(o);
        }
      }
      o << "\n";
    }
  }